

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall Lowerer::LoadLibraryValueOpnd(Lowerer *this,Instr *instr,LibraryValue valueType)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContextInfo *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  ThreadContextInfo *pTVar5;
  intptr_t iVar6;
  undefined4 extraout_var_16;
  undefined4 *puVar7;
  ScriptContextInfo *scriptContextInfo;
  LibraryValue valueType_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pSVar4 = Func::GetScriptContextInfo(instr->m_func);
  switch(valueType) {
  case ValueUndeclBlockVar:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[4])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueEmptyString:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[5])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var,iVar3),AddrOpndKindDynamicVar,instr->m_func
                                   ,true,(Var)0x0);
    break;
  case ValueUndefined:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[1])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_01,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueNull:
    iVar3 = (**pSVar4->_vptr_ScriptContextInfo)();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_02,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueTrue:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[2])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_03,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueFalse:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[3])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_04,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueNegativeZero:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[6])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_05,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueNumberTypeStatic:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[7])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_06,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueStringTypeStatic:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[8])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_07,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueSymbolTypeStatic:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[9])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_08,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,true,(Var)0x0);
    break;
  case ValueObjectType:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[10])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_09,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,false,(Var)0x0);
    break;
  case ValueObjectHeaderInlinedType:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0xb])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_10,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,false,(Var)0x0);
    break;
  case ValueRegexType:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0xc])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_11,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,false,(Var)0x0);
    break;
  case ValueArrayConstructor:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x10])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_12,iVar3),AddrOpndKindDynamicVar,
                                   instr->m_func,false,(Var)0x0);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0xc9d,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    this_local = (Lowerer *)0x0;
    break;
  case ValueJavascriptArrayType:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0xd])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_13,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,false,(Var)0x0);
    break;
  case ValueNativeIntArrayType:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0xe])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_14,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,false,(Var)0x0);
    break;
  case ValueNativeFloatArrayType:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0xf])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_15,iVar3),AddrOpndKindDynamicType,
                                   instr->m_func,false,(Var)0x0);
    break;
  case ValueConstructorCacheDefaultInstance:
    pTVar5 = Func::GetThreadContextInfo(this->m_func);
    iVar6 = ThreadContextInfo::GetConstructorCacheDefaultInstanceAddr(pTVar5);
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(iVar6,AddrOpndKindDynamicMisc,instr->m_func,false,(Var)0x0);
    break;
  case ValueAbsDoubleCst:
    pTVar5 = Func::GetThreadContextInfo(this->m_func);
    iVar6 = ThreadContextInfo::GetAbsDoubleCstAddr(pTVar5);
    this_local = (Lowerer *)
                 IR::MemRefOpnd::New(iVar6,TyFloat64,instr->m_func,AddrOpndKindDynamicDoubleRef);
    break;
  case ValueCharStringCache:
    iVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x11])();
    this_local = (Lowerer *)
                 IR::AddrOpnd::New(CONCAT44(extraout_var_16,iVar3),
                                   AddrOpndKindDynamicCharStringCache,instr->m_func,false,(Var)0x0);
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::LoadLibraryValueOpnd(IR::Instr * instr, LibraryValue valueType)
{
    ScriptContextInfo *scriptContextInfo = instr->m_func->GetScriptContextInfo();
    switch (valueType)
    {
    case LibraryValue::ValueEmptyString:
        return IR::AddrOpnd::New(scriptContextInfo->GetEmptyStringAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueUndeclBlockVar:
        return IR::AddrOpnd::New(scriptContextInfo->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueUndefined:
        return IR::AddrOpnd::New(scriptContextInfo->GetUndefinedAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueNull:
        return IR::AddrOpnd::New(scriptContextInfo->GetNullAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueTrue:
        return IR::AddrOpnd::New(scriptContextInfo->GetTrueAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueFalse:
        return IR::AddrOpnd::New(scriptContextInfo->GetFalseAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueNegativeZero:
        return IR::AddrOpnd::New(scriptContextInfo->GetNegativeZeroAddr(), IR::AddrOpndKindDynamicVar, instr->m_func, true);
    case LibraryValue::ValueNumberTypeStatic:
        return IR::AddrOpnd::New(scriptContextInfo->GetNumberTypeStaticAddr(), IR::AddrOpndKindDynamicType, instr->m_func, true);
    case LibraryValue::ValueStringTypeStatic:
        return IR::AddrOpnd::New(scriptContextInfo->GetStringTypeStaticAddr(), IR::AddrOpndKindDynamicType, instr->m_func, true);
    case LibraryValue::ValueSymbolTypeStatic:
        return IR::AddrOpnd::New(scriptContextInfo->GetSymbolTypeStaticAddr(), IR::AddrOpndKindDynamicType, instr->m_func, true);
    case LibraryValue::ValueObjectType:
        return IR::AddrOpnd::New(scriptContextInfo->GetObjectTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueObjectHeaderInlinedType:
        return IR::AddrOpnd::New(scriptContextInfo->GetObjectHeaderInlinedTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueRegexType:
        return IR::AddrOpnd::New(scriptContextInfo->GetRegexTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueArrayConstructor:
        return IR::AddrOpnd::New(scriptContextInfo->GetArrayConstructorAddr(), IR::AddrOpndKindDynamicVar, instr->m_func);
    case LibraryValue::ValueJavascriptArrayType:
        return IR::AddrOpnd::New(scriptContextInfo->GetArrayTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueNativeIntArrayType:
        return IR::AddrOpnd::New(scriptContextInfo->GetNativeIntArrayTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueNativeFloatArrayType:
        return IR::AddrOpnd::New(scriptContextInfo->GetNativeFloatArrayTypeAddr(), IR::AddrOpndKindDynamicType, instr->m_func);
    case LibraryValue::ValueConstructorCacheDefaultInstance:
        return IR::AddrOpnd::New(m_func->GetThreadContextInfo()->GetConstructorCacheDefaultInstanceAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func);
    case LibraryValue::ValueAbsDoubleCst:
        return IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetAbsDoubleCstAddr(), TyMachDouble, instr->m_func, IR::AddrOpndKindDynamicDoubleRef);
    case LibraryValue::ValueCharStringCache:
        return IR::AddrOpnd::New(scriptContextInfo->GetCharStringCacheAddr(), IR::AddrOpndKindDynamicCharStringCache, instr->m_func);
    default:
        Assert(UNREACHED);
        return nullptr;
    }
}